

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O3

void __thiscall Calculator::loadFile(Calculator *this,string *fileName,bool printIfNotFound)

{
  char cVar1;
  ostream *poVar2;
  string line;
  ifstream stream;
  undefined1 auStack_258 [8];
  string local_250;
  long local_230 [4];
  byte abStack_210 [488];
  
  std::ifstream::ifstream(local_230,(string *)fileName,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    if (printIfNotFound) {
      poVar2 = this->mOutputStream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Could not open the file \'",0x19);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'.",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  }
  else {
    local_250._M_string_length = 0;
    local_250.field_2._M_local_buf[0] = '\0';
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    while ((abStack_210[*(long *)(local_230[0] + -0x18)] & 2) == 0) {
      cVar1 = std::ios::widen((char)auStack_258 + (char)*(long *)(local_230[0] + -0x18) + '(');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_230,(string *)&local_250,cVar1);
      execute(this,&local_250,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                               local_250.field_2._M_local_buf[0]) + 1);
    }
  }
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

void Calculator::loadFile(const std::string& fileName, bool printIfNotFound) {
	std::ifstream stream(fileName);

	if (stream.is_open()) {
		std::string line;

		while (!stream.eof()) {
			std::getline(stream, line);
			execute(line, false);
		}
	} else if (printIfNotFound) {
		mOutputStream << "Could not open the file '" << fileName << "'." << std::endl;
	}
}